

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_addr_ps_mips(CPUMIPSState *env,uint64_t fdt0,uint64_t fdt1)

{
  float32 fVar1;
  float32 fVar2;
  uintptr_t unaff_retaddr;
  uint32_t fsth2;
  uint32_t fst2;
  uint32_t fsth1;
  uint32_t fst1;
  uint32_t fsth0;
  uint32_t fst0;
  uint64_t fdt1_local;
  uint64_t fdt0_local;
  CPUMIPSState *env_local;
  
  fVar1 = float32_add_mips((float32)fdt0,(float32)(fdt0 >> 0x20),&(env->active_fpu).fp_status);
  fVar2 = float32_add_mips((float32)fdt1,(float32)(fdt1 >> 0x20),&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(fVar2,fVar1);
}

Assistant:

uint64_t helper_float_addr_ps(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt1)
{
    uint32_t fst0 = fdt0 & 0XFFFFFFFF;
    uint32_t fsth0 = fdt0 >> 32;
    uint32_t fst1 = fdt1 & 0XFFFFFFFF;
    uint32_t fsth1 = fdt1 >> 32;
    uint32_t fst2;
    uint32_t fsth2;

    fst2 = float32_add(fst0, fsth0, &env->active_fpu.fp_status);
    fsth2 = float32_add(fst1, fsth1, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}